

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O1

TestFactoryRegistry * __thiscall
CppUnit::TestFactoryRegistryList::getInternalRegistry(TestFactoryRegistryList *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  TestFactoryRegistry *this_00;
  string local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>
  local_48;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CppUnit::TestFactoryRegistry_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->m_registries)._M_t._M_impl.super__Rb_tree_header)
  {
    this_00 = (TestFactoryRegistry *)operator_new(0x58);
    pcVar2 = (name->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
    TestFactoryRegistry::TestFactoryRegistry(this_00,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_48.first.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_48.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
    local_48.second = this_00;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>,std::_Select1st<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>,std::_Select1st<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CppUnit::TestFactoryRegistry*>>>
                *)this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.first._M_dataplus._M_p,
                      local_48.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = *(TestFactoryRegistry **)(iVar3._M_node + 2);
  }
  return this_00;
}

Assistant:

TestFactoryRegistry *getInternalRegistry( const std::string &name )
  {
    Registries::const_iterator foundIt = m_registries.find( name );
    if ( foundIt == m_registries.end() )
    {
      TestFactoryRegistry *factory = new TestFactoryRegistry( name );
      m_registries.insert( std::pair<const std::string, TestFactoryRegistry*>( name, factory ) );
      return factory;
    }
    return (*foundIt).second;
  }